

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O3

int ffi_pairs(lua_State *L,MMS mm)

{
  uint uVar1;
  CTState *cts;
  int iVar2;
  GCcdata *pGVar3;
  cTValue *tv;
  GCstr *pGVar4;
  uint id;
  
  cts = *(CTState **)((L->glref).ptr64 + 0x180);
  cts->L = L;
  pGVar3 = ffi_checkcdata(L,mm);
  uVar1 = cts->tab[pGVar3->ctypeid].info;
  id = (uint)pGVar3->ctypeid;
  if ((uVar1 & 0xf0000000) == 0x20000000) {
    id = uVar1 & 0xffff;
  }
  tv = lj_ctype_meta(cts,id,mm);
  if (tv == (cTValue *)0x0) {
    pGVar4 = lj_ctype_repr(L,id,(GCstr *)0x0);
    lj_err_callerv(L,LJ_ERR_FFI_BADMM,pGVar4 + 1,
                   *(long *)((L->glref).ptr64 + 0x1a8 + (ulong)mm * 8) + 0x18);
  }
  iVar2 = lj_meta_tailcall(L,tv);
  return iVar2;
}

Assistant:

static int ffi_pairs(lua_State *L, MMS mm)
{
  CTState *cts = ctype_cts(L);
  CTypeID id = ffi_checkcdata(L, 1)->ctypeid;
  CType *ct = ctype_raw(cts, id);
  cTValue *tv;
  if (ctype_isptr(ct->info)) id = ctype_cid(ct->info);
  tv = lj_ctype_meta(cts, id, mm);
  if (!tv)
    lj_err_callerv(L, LJ_ERR_FFI_BADMM, strdata(lj_ctype_repr(L, id, NULL)),
		   strdata(mmname_str(G(L), mm)));
  return lj_meta_tailcall(L, tv);
}